

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbclipboard.cpp
# Opt level: O0

void __thiscall QXcbClipboardMime::~QXcbClipboardMime(QXcbClipboardMime *this)

{
  QXcbClipboardMime *in_RDI;
  
  ~QXcbClipboardMime(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

class QXcbClipboardMime : public QXcbMime
{
    Q_OBJECT
public:
    QXcbClipboardMime(QClipboard::Mode mode, QXcbClipboard *clipboard)
        : QXcbMime()
        , m_clipboard(clipboard)
    {
        switch (mode) {
        case QClipboard::Selection:
            modeAtom = XCB_ATOM_PRIMARY;
            break;

        case QClipboard::Clipboard:
            modeAtom = m_clipboard->atom(QXcbAtom::AtomCLIPBOARD);
            break;

        default:
            qCWarning(lcQpaClipboard, "QXcbClipboardMime: Internal error: Unsupported clipboard mode");
            break;
        }
    }

    void reset()
    {
        formatList.clear();
    }